

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_gtest_tests.cpp
# Opt level: O0

void __thiscall
syntax_gtest_tests::iu_SyntaxTest_x_iutest_x_AlmostLongDoubleEq_Test::Body
          (iu_SyntaxTest_x_iutest_x_AlmostLongDoubleEq_Test *this)

{
  bool bVar1;
  char *pcVar2;
  longdouble *in_R9;
  AssertionHelper local_860;
  Fixed local_830;
  longdouble local_6a8;
  undefined1 local_690 [8];
  AssertionResult iutest_ar_3;
  longdouble x_3;
  AssertionHelper local_650;
  Fixed local_620;
  longdouble local_498;
  undefined1 local_480 [8];
  AssertionResult iutest_ar_2;
  longdouble x_2;
  AssertionHelper local_440;
  Fixed local_410;
  longdouble local_288;
  undefined1 local_270 [8];
  AssertionResult iutest_ar_1;
  longdouble x_1;
  AssertionHelper local_230;
  Fixed local_200;
  longdouble local_68;
  undefined1 local_50 [8];
  AssertionResult iutest_ar;
  longdouble x;
  iu_SyntaxTest_x_iutest_x_AlmostLongDoubleEq_Test *this_local;
  
  unique0x00076300 = (longdouble)1;
  if ((unique0x00076300 != (longdouble)0) || (NAN(unique0x00076300) || NAN((longdouble)0))) {
    iutest::detail::AlwaysZero();
    local_68 = (longdouble)1;
    iutest::internal::backward::AlmostEqHelper<false>::Compare<long_double,long_double>
              ((AssertionResult *)local_50,(AlmostEqHelper<false> *)0x544b51,"x",(char *)&local_68,
               (longdouble *)&iutest_ar.m_result,in_R9);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
    if (!bVar1) {
      memset(&local_200,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_200);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_50);
      iutest::AssertionHelper::AssertionHelper
                (&local_230,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
                 ,0x121,pcVar2,kFatalFailure);
      iutest::AssertionHelper::operator=(&local_230,&local_200);
      iutest::AssertionHelper::~AssertionHelper(&local_230);
      iutest::AssertionHelper::Fixed::~Fixed(&local_200);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_50);
    if (!bVar1) {
      return;
    }
  }
  unique0x00076300 = (longdouble)1;
  if ((unique0x00076300 != (longdouble)0) || (NAN(unique0x00076300) || NAN((longdouble)0))) {
    iutest::detail::AlwaysZero();
    local_288 = (longdouble)1;
    iutest::internal::backward::AlmostEqHelper<false>::Compare<long_double,long_double>
              ((AssertionResult *)local_270,(AlmostEqHelper<false> *)0x544b51,"x",(char *)&local_288
               ,(longdouble *)&iutest_ar_1.m_result,in_R9);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
    if (!bVar1) {
      memset(&local_410,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_410);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_270);
      iutest::AssertionHelper::AssertionHelper
                (&local_440,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
                 ,0x123,pcVar2,kNonFatalFailure);
      iutest::AssertionHelper::operator=(&local_440,&local_410);
      iutest::AssertionHelper::~AssertionHelper(&local_440);
      iutest::AssertionHelper::Fixed::~Fixed(&local_410);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_270);
  }
  unique0x00076300 = (longdouble)1;
  if ((unique0x00076300 != (longdouble)0) || (NAN(unique0x00076300) || NAN((longdouble)0))) {
    iutest::detail::AlwaysZero();
    local_498 = (longdouble)1;
    iutest::internal::backward::AlmostEqHelper<false>::Compare<long_double,long_double>
              ((AssertionResult *)local_480,(AlmostEqHelper<false> *)0x544b51,"x",(char *)&local_498
               ,(longdouble *)&iutest_ar_2.m_result,in_R9);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_480);
    if (!bVar1) {
      memset(&local_620,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_620);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_480);
      iutest::AssertionHelper::AssertionHelper
                (&local_650,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
                 ,0x125,pcVar2,kWarning);
      iutest::AssertionHelper::operator=(&local_650,&local_620);
      iutest::AssertionHelper::~AssertionHelper(&local_650);
      iutest::AssertionHelper::Fixed::~Fixed(&local_620);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_480);
  }
  unique0x00076300 = (longdouble)1;
  if ((unique0x00076300 != (longdouble)0) || (NAN(unique0x00076300) || NAN((longdouble)0))) {
    iutest::detail::AlwaysZero();
    local_6a8 = (longdouble)1;
    iutest::internal::backward::AlmostEqHelper<false>::Compare<long_double,long_double>
              ((AssertionResult *)local_690,(AlmostEqHelper<false> *)0x544b51,"x",(char *)&local_6a8
               ,(longdouble *)&iutest_ar_3.m_result,in_R9);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_690);
    if (!bVar1) {
      memset(&local_830,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_830);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_690);
      iutest::AssertionHelper::AssertionHelper
                (&local_860,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
                 ,0x127,pcVar2,kAssumeFailure);
      iutest::AssertionHelper::operator=(&local_860,&local_830);
      iutest::AssertionHelper::~AssertionHelper(&local_860);
      iutest::AssertionHelper::Fixed::~Fixed(&local_830);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_690);
  }
  return;
}

Assistant:

TEST(SyntaxTest, AlmostLongDoubleEq)
{
    if( long double x = 1.0l )
        ASSERT_ALMOST_EQ(1.0l, x);
    if( long double x = 1.0l )
        EXPECT_ALMOST_EQ(1.0l, x);
    if( long double x = 1.0l )
        INFORM_ALMOST_EQ(1.0l, x);
    if( long double x = 1.0l )
        ASSUME_ALMOST_EQ(1.0l, x);
}